

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O3

void __thiscall XMISong::FoundXMID(XMISong *this,BYTE *chunk,int len,TrackInfo *song)

{
  size_t sVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  
  if (7 < len) {
    iVar3 = 0;
    do {
      bVar2 = chunk[(long)iVar3 + 7];
      sVar1 = (ulong)bVar2 +
              ((ulong)chunk[(long)iVar3 + 6] << 8 |
              (long)(int)((uint)chunk[(long)iVar3 + 4] << 0x18) |
              (ulong)chunk[(long)iVar3 + 5] << 0x10);
      iVar4 = (int)sVar1;
      if (*(int *)(chunk + iVar3) == 0x424d4954) {
        song->TimbreChunk = chunk + (long)iVar3 + 8;
        song->TimbreLen = sVar1;
      }
      else if (*(int *)(chunk + iVar3) == 0x544e5645) {
        song->EventChunk = chunk + (long)iVar3 + 8;
        song->EventLen = (long)iVar4;
        return;
      }
      iVar3 = iVar3 + (bVar2 & 1) + iVar4 + 8;
    } while (iVar3 <= len + -8);
  }
  return;
}

Assistant:

void XMISong::FoundXMID(const BYTE *chunk, int len, TrackInfo *song) const
{
	for (int p = 0; p <= len - 8; )
	{
		int chunktype = GetNativeInt(chunk + p);
		int chunklen = GetBigInt(chunk + p + 4);

		if (chunktype == MAKE_ID('T','I','M','B'))
		{
			song->TimbreChunk = chunk + p + 8;
			song->TimbreLen = chunklen;
		}
		else if (chunktype == MAKE_ID('E','V','N','T'))
		{
			song->EventChunk = chunk + p + 8;
			song->EventLen = chunklen;
			// EVNT must be the final chunk in the FORM.
			break;
		}
		p += 8 + chunklen + (chunklen & 1);
	}
}